

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  archive_string *as;
  archive_string *as_00;
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  time_t tVar14;
  void *__dest;
  uint uVar15;
  ulong *puVar16;
  int unaff_EBX;
  ulong uVar17;
  char *pcVar18;
  byte *pbVar19;
  long lVar20;
  int iVar21;
  
  pvVar7 = a->format->data;
  as = &file->symlink;
  as_00 = &file->name;
  do {
    pbVar19 = p + 4;
    if (((end < pbVar19) || (bVar2 = *p, 0x19 < (byte)(bVar2 + 0xbf))) ||
       (bVar3 = p[1], 0x19 < (byte)(bVar3 + 0xbf))) {
      return 0;
    }
    bVar4 = p[2];
    if ((ulong)bVar4 < 4) {
      return 0;
    }
    if (end < p + bVar4) {
      return 0;
    }
    bVar5 = p[3];
    if (0xc < bVar2 - 0x4e) {
      if (bVar2 == 0x43) {
        if (bVar3 == 0x4c) {
          if (bVar4 == 0xc && bVar5 == 1) {
            file->cl_offset = (ulong)*(uint *)(p + 4) * *(long *)((long)pvVar7 + 0xa8);
            goto switchD_003cfb7e_caseD_3;
          }
        }
        else if ((bVar3 == 0x45) && (bVar4 == 0x1c && bVar5 == 1)) {
          bVar2 = p[7];
          bVar3 = p[6];
          bVar4 = p[5];
          bVar5 = p[4];
          uVar15 = *(uint *)(p + 0xc);
          file->ce_offset = uVar15;
          uVar12 = *(uint *)(p + 0x14);
          file->ce_size = uVar12;
          pvVar8 = a->format->data;
          uVar17 = ((ulong)bVar4 << 8 | (long)(int)((uint)bVar2 << 0x18) | (ulong)bVar3 << 0x10 |
                   (ulong)bVar5) * *(ulong *)((long)pvVar8 + 0xa8);
          if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar17)) ||
             (((uVar17 < *(ulong *)((long)pvVar8 + 0xa0) ||
               (uVar13 = (ulong)uVar12 + (ulong)uVar15, *(ulong *)((long)pvVar8 + 0xa8) < uVar13))
              || (*(ulong *)((long)pvVar8 + 0xb0) < uVar13 + uVar17)))) {
            archive_set_error(&a->archive,-1,"Invalid parameter in SUSP \"CE\" extension");
LAB_003cfc86:
            bVar11 = false;
          }
          else {
            iVar21 = *(int *)((long)pvVar8 + 0x40);
            iVar6 = *(int *)((long)pvVar8 + 0x44);
            if (iVar6 <= iVar21) {
              uVar15 = iVar6 * 2;
              if (iVar6 < 0x10) {
                uVar15 = 0x10;
              }
              if (((int)uVar15 <= iVar6) ||
                 (__dest = calloc((ulong)uVar15,0x10), __dest == (void *)0x0)) {
                archive_set_error(&a->archive,0xc,"Out of memory");
                goto LAB_003cfc86;
              }
              if (*(void **)((long)pvVar8 + 0x38) != (void *)0x0) {
                memcpy(__dest,*(void **)((long)pvVar8 + 0x38),(long)iVar21 << 4);
                free(*(void **)((long)pvVar8 + 0x38));
              }
              *(void **)((long)pvVar8 + 0x38) = __dest;
              *(uint *)((long)pvVar8 + 0x44) = uVar15;
            }
            uVar15 = *(uint *)((long)pvVar8 + 0x40);
            *(uint *)((long)pvVar8 + 0x40) = uVar15 + 1;
            uVar13 = (ulong)uVar15;
            if (0 < (int)uVar15) {
              do {
                uVar15 = (int)uVar13 - 1;
                uVar10 = (ulong)(uVar15 >> 1);
                lVar9 = *(long *)((long)pvVar8 + 0x38);
                lVar20 = uVar10 * 0x10;
                puVar1 = (ulong *)(lVar9 + uVar13 * 0x10);
                if (*(ulong *)(lVar9 + lVar20) <= uVar17) {
                  *puVar1 = uVar17;
                  *(file_info **)(lVar9 + 8 + uVar13 * 0x10) = file;
                  goto LAB_003d032c;
                }
                puVar16 = (ulong *)(lVar9 + lVar20);
                uVar13 = puVar16[1];
                *puVar1 = *puVar16;
                puVar1[1] = uVar13;
                uVar13 = uVar10;
              } while (1 < uVar15);
            }
            puVar1 = *(ulong **)((long)pvVar8 + 0x38);
            *puVar1 = uVar17;
            puVar1[1] = (ulong)file;
LAB_003d032c:
            bVar11 = true;
          }
          if (!bVar11) {
            unaff_EBX = -0x1e;
            bVar11 = false;
            goto LAB_003d0216;
          }
        }
      }
      goto switchD_003cfb2c_caseD_4f;
    }
    uVar15 = (uint)bVar4;
    switch((uint)bVar2) {
    case 0x4e:
      if (bVar5 != 1 || bVar3 != 0x4d) break;
      if (file->name_continues == '\0') {
        (file->name).length = 0;
      }
      file->name_continues = '\0';
      if (bVar4 < 5) goto switchD_003cfb7e_caseD_3;
      switch(*pbVar19) {
      case 0:
        if (bVar4 != 5) {
          archive_strncat(as_00,p + 5,(ulong)(uVar15 - 5));
        }
        break;
      case 1:
        if (bVar4 != 5) {
          archive_strncat(as_00,p + 5,(ulong)(uVar15 - 5));
          file->name_continues = '\x01';
        }
        break;
      case 2:
        pcVar18 = ".";
        goto LAB_003d01fc;
      case 4:
        pcVar18 = "..";
LAB_003d01fc:
        archive_strcat(as_00,pcVar18);
      }
switchD_003cfb7e_caseD_3:
      *(undefined1 *)((long)pvVar7 + 0x28) = 1;
      break;
    case 0x50:
      if (bVar3 == 0x4e) {
        if (bVar4 == 0x14 && bVar5 == 1) {
          uVar15 = toi(pbVar19,4);
          file->rdev = (ulong)uVar15 << 0x20;
          uVar12 = toi(p + 0xc,4);
          file->rdev = CONCAT44(uVar15,uVar12);
          goto switchD_003cfb7e_caseD_3;
        }
      }
      else if (bVar5 == 1 && bVar3 == 0x58) {
        if (0xb < bVar4) {
          uVar15 = toi(pbVar19,4);
          file->mode = uVar15;
        }
        if (0x13 < bVar4) {
          uVar15 = toi(p + 0xc,4);
          file->nlinks = uVar15;
        }
        if (0x1b < bVar4) {
          uVar15 = toi(p + 0x14,4);
          file->uid = uVar15;
        }
        if (0x23 < bVar4) {
          uVar15 = toi(p + 0x1c,4);
          file->gid = uVar15;
        }
        if (0x2b < bVar4) {
          uVar15 = toi(p + 0x24,4);
          file->number = (ulong)uVar15;
        }
        goto switchD_003cfb7e_caseD_3;
      }
      break;
    case 0x52:
      if (bVar5 == 1 && bVar3 == 0x45) {
        file->re = '\x01';
        *(undefined1 *)((long)pvVar7 + 0x28) = 1;
      }
      break;
    case 0x53:
      if (bVar3 == 0x4c) {
        if (bVar5 == 1) {
          if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
            (file->symlink).length = 0;
          }
          file->symlink_continues = '\0';
          if (4 < bVar4) {
            if (*pbVar19 != 0) {
              if (*pbVar19 != 1) goto LAB_003cfe95;
              file->symlink_continues = '\x01';
            }
            pbVar19 = p + 5;
            iVar21 = uVar15 - 5;
            pcVar18 = "";
            do {
              if (iVar21 < 2) break;
              bVar2 = *pbVar19;
              bVar3 = pbVar19[1];
              uVar17 = (ulong)bVar3;
              pbVar19 = pbVar19 + 2;
              iVar21 = iVar21 + -2;
              archive_strcat(as,pcVar18);
              uVar15 = (uint)bVar3;
              switch(bVar2) {
              case 0:
                if (iVar21 < (int)uVar15) goto switchD_003cfdcf_caseD_3;
                archive_strncat(as,pbVar19,uVar17);
                goto LAB_003cfe62;
              case 1:
                if ((int)uVar15 <= iVar21) {
                  archive_strncat(as,pbVar19,uVar17);
                  goto LAB_003cfe7b;
                }
              case 3:
              case 5:
              case 6:
              case 7:
switchD_003cfdcf_caseD_3:
                bVar11 = false;
                pcVar18 = "/";
                goto LAB_003cfe8d;
              case 2:
                pcVar18 = ".";
                break;
              case 4:
                pcVar18 = "..";
                break;
              case 8:
                archive_strcat(as,"/");
LAB_003cfe7b:
                pcVar18 = "";
                goto LAB_003cfe82;
              default:
                if (bVar2 == 0x10) {
                  (file->symlink).length = 0;
                  pcVar18 = "ROOT";
                }
                else {
                  if (bVar2 != 0x20) goto switchD_003cfdcf_caseD_3;
                  pcVar18 = "hostname";
                }
              }
              archive_strcat(as,pcVar18);
LAB_003cfe62:
              pcVar18 = "/";
LAB_003cfe82:
              pbVar19 = pbVar19 + uVar17;
              iVar21 = iVar21 - uVar15;
              bVar11 = true;
LAB_003cfe8d:
            } while (bVar11);
          }
LAB_003cfe95:
          *(undefined1 *)((long)pvVar7 + 0x28) = 1;
        }
        break;
      }
      if (((bVar3 != 0x54) || (bVar4 != 4)) || (bVar5 != 1)) break;
      *(undefined2 *)((long)pvVar7 + 0x28) = 0;
      unaff_EBX = 0;
      bVar11 = false;
      goto LAB_003d0216;
    case 0x54:
      if (bVar5 == 1 && bVar3 == 0x46) {
        if (4 < bVar4) {
          bVar2 = p[4];
          pbVar19 = p + 5;
          iVar21 = bVar4 - 5;
          if ((char)bVar2 < '\0') {
            if (0x15 < bVar4 && (bVar2 & 1) != 0) {
              file->birthtime_is_set = 1;
              tVar14 = isodate17(pbVar19);
              file->birthtime = tVar14;
              pbVar19 = p + 0x16;
              iVar21 = uVar15 - 0x16;
            }
            if (((bVar2 & 2) != 0) && (0x10 < iVar21)) {
              tVar14 = isodate17(pbVar19);
              file->mtime = tVar14;
              pbVar19 = pbVar19 + 0x11;
              iVar21 = iVar21 + -0x11;
            }
            if (((bVar2 & 4) != 0) && (0x10 < iVar21)) {
              tVar14 = isodate17(pbVar19);
              file->atime = tVar14;
              pbVar19 = pbVar19 + 0x11;
              iVar21 = iVar21 + -0x11;
            }
            if (((bVar2 & 8) != 0) && (0x10 < iVar21)) {
              tVar14 = isodate17(pbVar19);
              goto LAB_003d01a0;
            }
          }
          else {
            if (0xb < bVar4 && (bVar2 & 1) != 0) {
              file->birthtime_is_set = 1;
              tVar14 = isodate7(pbVar19);
              file->birthtime = tVar14;
              pbVar19 = p + 0xc;
              iVar21 = uVar15 - 0xc;
            }
            if (((bVar2 & 2) != 0) && (6 < iVar21)) {
              tVar14 = isodate7(pbVar19);
              file->mtime = tVar14;
              pbVar19 = pbVar19 + 7;
              iVar21 = iVar21 + -7;
            }
            if (((bVar2 & 4) != 0) && (6 < iVar21)) {
              tVar14 = isodate7(pbVar19);
              file->atime = tVar14;
              pbVar19 = pbVar19 + 7;
              iVar21 = iVar21 + -7;
            }
            if (((bVar2 & 8) != 0) && (6 < iVar21)) {
              tVar14 = isodate7(pbVar19);
LAB_003d01a0:
              file->ctime = tVar14;
            }
          }
        }
        *(undefined1 *)((long)pvVar7 + 0x28) = 1;
      }
      break;
    case 0x5a:
      if ((((bVar5 == 1 && bVar3 == 0x46) && (*pbVar19 == 0x70)) && (bVar4 == 0x10)) &&
         (p[5] == 0x7a)) {
        file->pz = 1;
        file->pz_log2_bs = (uint)p[7];
        file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
      }
    }
switchD_003cfb2c_caseD_4f:
    p = p + p[2];
    bVar11 = true;
LAB_003d0216:
    if (!bVar11) {
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
	}
	return (ARCHIVE_OK);
}